

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
optTyped_otherTypeCopyAssignmentNotEmptyForNotEmpty_Test<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
::TestBody(optTyped_otherTypeCopyAssignmentNotEmptyForNotEmpty_Test<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
           *this)

{
  bool bVar1;
  char *pcVar2;
  weekday *pwVar3;
  char *in_R9;
  AssertHelper local_208;
  Message local_200;
  weekday local_1f1;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_5;
  Message local_1d8;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_4;
  Message local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_180;
  Message local_178;
  bool local_169;
  undefined1 local_168 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_138;
  Message local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar__2;
  Message local_110;
  char local_101;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_2;
  Message local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_1;
  Message local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_90;
  Message local_88;
  bool local_79;
  undefined1 local_78 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_48 [3];
  Message local_30;
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  opt_type o2;
  other_opt_type o1;
  optTyped_otherTypeCopyAssignmentNotEmptyForNotEmpty_Test<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
  *this_local;
  
  mp::opt<signed_char,_mp::opt_null_value_policy<signed_char,_(signed_char)'\xff'>_>::
  opt<const_signed_char_&,_true,_true>
            ((opt<signed_char,_mp::opt_null_value_policy<signed_char,_(signed_char)__xff_>_> *)
             ((long)&gtest_ar_.message_.ptr_ + 7),
             &(this->
              super_optTyped<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
              ).other_value_1);
  mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>::
  opt<const_(anonymous_namespace)::weekday_&,_true,_true>
            ((opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
              *)((long)&gtest_ar_.message_.ptr_ + 6),
             &(this->
              super_optTyped<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
              ).value_2);
  mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>::
  operator=<signed_char,_mp::opt_null_value_policy<signed_char,_(signed_char)__xff_>,_true>
            ((opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
              *)((long)&gtest_ar_.message_.ptr_ + 6),
             (opt<signed_char,_mp::opt_null_value_policy<signed_char,_(signed_char)__xff_>_> *)
             ((long)&gtest_ar_.message_.ptr_ + 7));
  testing::AssertionResult::
  AssertionResult<mp::opt<signed_char,mp::opt_null_value_policy<signed_char,(signed_char)_1>>>
            ((AssertionResult *)local_28,
             (opt<signed_char,_mp::opt_null_value_policy<signed_char,_(signed_char)__xff_>_> *)
             ((long)&gtest_ar_.message_.ptr_ + 7),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(&local_30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_28,(AssertionResult *)0x20bf26,
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x2c2,pcVar2);
    testing::internal::AssertHelper::operator=(local_48,&local_30);
    testing::internal::AssertHelper::~AssertHelper(local_48);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  local_79 = mp::opt<signed_char,_mp::opt_null_value_policy<signed_char,_(signed_char)'\xff'>_>::
             has_value((opt<signed_char,_mp::opt_null_value_policy<signed_char,_(signed_char)__xff_>_>
                        *)((long)&gtest_ar_.message_.ptr_ + 7));
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_78,&local_79,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_78,(AssertionResult *)"o1.has_value()"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x2c3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  pcVar2 = mp::opt<signed_char,_mp::opt_null_value_policy<signed_char,_(signed_char)'\xff'>_>::
           operator*((opt<signed_char,_mp::opt_null_value_policy<signed_char,_(signed_char)__xff_>_>
                      *)((long)&gtest_ar_.message_.ptr_ + 7));
  testing::internal::EqHelper<false>::Compare<(anonymous_namespace)::weekday,signed_char>
            ((EqHelper<false> *)local_c0,"this->value_1","*o1",
             &(this->
              super_optTyped<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
              ).value_1,pcVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x2c4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  pcVar2 = mp::opt<signed_char,_mp::opt_null_value_policy<signed_char,_(signed_char)'\xff'>_>::value
                     ((opt<signed_char,_mp::opt_null_value_policy<signed_char,_(signed_char)__xff_>_>
                       *)((long)&gtest_ar_.message_.ptr_ + 7));
  testing::internal::EqHelper<false>::Compare<(anonymous_namespace)::weekday,signed_char>
            ((EqHelper<false> *)local_e0,"this->value_1","o1.value()",
             &(this->
              super_optTyped<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
              ).value_1,pcVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x2c5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  local_101 = mp::opt<signed_char,mp::opt_null_value_policy<signed_char,(signed_char)-1>>::
              value_or<signed_char_const&>
                        ((opt<signed_char,mp::opt_null_value_policy<signed_char,(signed_char)_1>> *)
                         ((long)&gtest_ar_.message_.ptr_ + 7),
                         &(this->
                          super_optTyped<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
                          ).other_value_2);
  testing::internal::EqHelper<false>::Compare<(anonymous_namespace)::weekday,signed_char>
            ((EqHelper<false> *)local_100,"this->value_1","o1.value_or(this->other_value_2)",
             &(this->
              super_optTyped<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
              ).value_1,&local_101);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x2c6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  testing::AssertionResult::
  AssertionResult<mp::opt<(anonymous_namespace)::weekday,mp::opt_default_policy<(anonymous_namespace)::weekday>>>
            ((AssertionResult *)local_128,
             (opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
              *)((long)&gtest_ar_.message_.ptr_ + 6),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_128,(AssertionResult *)0x20b8e9,
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x2c7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  local_169 = mp::
              opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
              ::has_value((opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
                           *)((long)&gtest_ar_.message_.ptr_ + 6));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_168,&local_169,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_168,
               (AssertionResult *)"o2.has_value()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x2c8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_180,&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  pwVar3 = mp::
           opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
           ::operator*((opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
                        *)((long)&gtest_ar_.message_.ptr_ + 6));
  testing::internal::EqHelper<false>::
  Compare<(anonymous_namespace)::weekday,(anonymous_namespace)::weekday>
            ((EqHelper<false> *)local_1b0,"this->value_1","*o2",
             &(this->
              super_optTyped<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
              ).value_1,pwVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x2c9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  pwVar3 = mp::
           opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
           ::value((opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
                    *)((long)&gtest_ar_.message_.ptr_ + 6));
  testing::internal::EqHelper<false>::
  Compare<(anonymous_namespace)::weekday,(anonymous_namespace)::weekday>
            ((EqHelper<false> *)local_1d0,"this->value_1","o2.value()",
             &(this->
              super_optTyped<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
              ).value_1,pwVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x2ca,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  local_1f1 = mp::
              opt<(anonymous_namespace)::weekday,mp::opt_default_policy<(anonymous_namespace)::weekday>>
              ::value_or<(anonymous_namespace)::weekday_const&>
                        ((opt<(anonymous_namespace)::weekday,mp::opt_default_policy<(anonymous_namespace)::weekday>>
                          *)((long)&gtest_ar_.message_.ptr_ + 6),
                         &(this->
                          super_optTyped<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
                          ).value_2);
  testing::internal::EqHelper<false>::
  Compare<(anonymous_namespace)::weekday,(anonymous_namespace)::weekday>
            ((EqHelper<false> *)local_1f0,"this->value_1","o2.value_or(this->value_2)",
             &(this->
              super_optTyped<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
              ).value_1,&local_1f1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(&local_200);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x2cb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_208,&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  return;
}

Assistant:

TYPED_TEST(optTyped, otherTypeCopyAssignmentNotEmptyForNotEmpty)
{
  using opt_type = typename TestFixture::type;
  using other_opt_type = opt<typename TestFixture::traits::other_type, typename TestFixture::traits::other_policy_type>;
  other_opt_type o1{this->other_value_1};
  opt_type o2{this->value_2};
  o2 = o1;
  EXPECT_TRUE(o1);
  EXPECT_TRUE(o1.has_value());
  EXPECT_EQ(this->value_1, *o1);
  EXPECT_EQ(this->value_1, o1.value());
  EXPECT_EQ(this->value_1, o1.value_or(this->other_value_2));
  EXPECT_TRUE(o2);
  EXPECT_TRUE(o2.has_value());
  EXPECT_EQ(this->value_1, *o2);
  EXPECT_EQ(this->value_1, o2.value());
  EXPECT_EQ(this->value_1, o2.value_or(this->value_2));
}